

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O2

int __thiscall
vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseSamplePosCorrectness>::init
          (MSCase<vkt::pipeline::multisample::MSCaseSamplePosCorrectness> *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  EVP_PKEY_CTX *ctx_00;
  MessageBuilder local_190;
  
  local_190.m_log =
       ((this->super_MSCaseBaseResolveAndPerSampleFetch).super_MultisampleCaseBase.super_TestCase.
        super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &local_190.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Verifying gl_SamplePosition correctness:\n");
  std::operator<<((ostream *)this_00,
                  "\t1) Varying values should be sampled at the sample position.\n");
  std::operator<<((ostream *)this_00,"\t\t=> fract(position_screen) == gl_SamplePosition\n");
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  iVar1 = tcu::TestNode::init((TestNode *)this,ctx_00);
  return iVar1;
}

Assistant:

void MSCase<MSCaseSamplePosCorrectness>::init (void)
{
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying gl_SamplePosition correctness:\n"
		<< "	1) Varying values should be sampled at the sample position.\n"
		<< "		=> fract(position_screen) == gl_SamplePosition\n"
		<< tcu::TestLog::EndMessage;

	MultisampleCaseBase::init();
}